

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchSet.cpp
# Opt level: O2

void Hpipe::anon_unknown_5::output_rec(ostream *ss,Node *node)

{
  double dVar1;
  double dVar2;
  ostream *poVar3;
  char *pcVar4;
  Node *pNVar5;
  
  pNVar5 = (node->ok).data;
  if (pNVar5 == (Node *)0x0) {
    if (node->name != (char *)0x0) {
      std::operator<<(ss,node->name);
    }
    std::operator<<(ss,"/*");
    ss = std::ostream::_M_insert<double>(node->freq);
    pcVar4 = "*/";
    goto LAB_0013ff54;
  }
  dVar1 = pNVar5->freq;
  dVar2 = ((node->ko).data)->freq;
  if (node->use_equ == true) {
    if (dVar1 < dVar2) {
      pcVar4 = "if ( *data != ";
      goto LAB_0013feae;
    }
    pcVar4 = "if ( *data == ";
LAB_0013ff01:
    poVar3 = std::operator<<(ss,pcVar4);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,node->beg);
    std::operator<<(poVar3," ) { ");
    output_rec(ss,(node->ok).data);
    std::operator<<(ss," } else { ");
    pNVar5 = (node->ko).data;
  }
  else {
    if (dVar2 <= dVar1) {
      pcVar4 = "if ( *data < ";
      goto LAB_0013ff01;
    }
    pcVar4 = "if ( *data >= ";
LAB_0013feae:
    poVar3 = std::operator<<(ss,pcVar4);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,node->beg);
    std::operator<<(poVar3," ) { ");
    output_rec(ss,(node->ko).data);
    std::operator<<(ss," } else { ");
    pNVar5 = (node->ok).data;
  }
  output_rec(ss,pNVar5);
  pcVar4 = " }";
LAB_0013ff54:
  std::operator<<(ss,pcVar4);
  return;
}

Assistant:

static void output_rec( std::ostream &ss, const BranchSet::Node *node ) {
    if ( node->ok ) {
        bool use_neg = node->ok->freq < node->ko->freq;
        if ( node->use_equ ) {
            if ( use_neg ) {
                ss << "if ( *data != " << node->beg << " ) { ";
                output_rec( ss, node->ko.ptr() );
                ss << " } else { ";
                output_rec( ss, node->ok.ptr() );
                ss << " }";
            } else {
                ss << "if ( *data == " << node->beg << " ) { ";
                output_rec( ss, node->ok.ptr() );
                ss << " } else { ";
                output_rec( ss, node->ko.ptr() );
                ss << " }";
            }
        } else {
            if ( use_neg ) {
                ss << "if ( *data >= " << node->beg << " ) { ";
                output_rec( ss, node->ko.ptr() );
                ss << " } else { ";
                output_rec( ss, node->ok.ptr() );
                ss << " }";
            } else {
                ss << "if ( *data < " << node->beg << " ) { ";
                output_rec( ss, node->ok.ptr() );
                ss << " } else { ";
                output_rec( ss, node->ko.ptr() );
                ss << " }";
            }
        }
    } else {
        if ( node->name )
            ss << node->name;
        ss << "/*" << node->freq << "*/";
    }
}